

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

substr __thiscall
c4::yml::Parser::_scan_plain_scalar_flow(Parser *this,csubstr currscalar,csubstr peeked_line)

{
  uint uVar1;
  code *pcVar2;
  Location LVar3;
  undefined1 auVar4 [24];
  bool bVar5;
  bool bVar6;
  int iVar7;
  size_t sVar8;
  char *pcVar9;
  long lVar10;
  char *pcVar11;
  ulong len_;
  void *pvVar12;
  pfn_error p_Var13;
  byte bVar14;
  ro_substr chars;
  ro_substr chars_00;
  ro_substr pattern;
  ro_substr s0;
  ro_substr chars_01;
  ro_substr chars_02;
  first_of_any_result fVar15;
  substr sVar16;
  csubstr cVar17;
  basic_substring<char> bVar18;
  ro_substr s1;
  csubstr local_108;
  char msg [72];
  uint uStack_98;
  undefined4 uStack_88;
  undefined4 uStack_84;
  size_t local_80;
  uint uStack_70;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  size_t local_58;
  csubstr tpkl;
  basic_substring<char> local_40;
  
  bVar14 = 0;
  chars.len = 7;
  chars.str = "[]{}?#,";
  local_108 = peeked_line;
  sVar8 = basic_substring<const_char>::first_of(&local_108,chars,0);
  bVar6 = true;
  while( true ) {
    if (sVar8 == 0) goto LAB_001d121d;
    uVar1 = this->m_state->flags;
    if ((~uVar1 & 0x44) == 0 || (uVar1 & 2) != 0) break;
LAB_001d0f18:
    if (sVar8 != 0xffffffffffffffff) {
      if (local_108.len < sVar8) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
          pcVar2 = (code *)swi(3);
          sVar16 = (substr)(*pcVar2)();
          return sVar16;
        }
        handle_error(0x1e71c6,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1569,"pos <= len || pos == npos");
      }
      basic_substring<const_char>::basic_substring
                ((basic_substring<const_char> *)msg,local_108.str,sVar8);
      local_108 = (csubstr)msg._0_16_;
      pcVar11 = (this->m_state->line_contents).rem.str;
      pcVar9 = (char *)msg._0_8_;
      sVar8 = msg._8_8_;
      if ((char *)(msg._0_8_ + msg._8_8_) < pcVar11) {
        pcVar11 = "check failed: (peeked_line.end() >= m_state->line_contents.rem.begin())";
        pcVar9 = msg;
        for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
          *(undefined8 *)pcVar9 = *(undefined8 *)pcVar11;
          pcVar11 = pcVar11 + ((ulong)bVar14 * -2 + 1) * 8;
          pcVar9 = pcVar9 + (ulong)bVar14 * -0x10 + 8;
        }
        if ((((byte)s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
          pcVar2 = (code *)swi(3);
          sVar16 = (substr)(*pcVar2)();
          return sVar16;
        }
        p_Var13 = (this->m_stack).m_callbacks.m_error;
        cVar17 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        pvVar12 = (this->m_stack).m_callbacks.m_user_data;
        local_80 = cVar17.len;
        uStack_98 = 0x756b;
        uStack_88 = cVar17.str._0_4_;
        uStack_84 = cVar17.str._4_4_;
LAB_001d11e5:
        auVar4 = ZEXT424(uStack_98) << 0x40;
        LVar3.name.str._0_4_ = uStack_88;
        LVar3.super_LineCol.offset = auVar4._0_8_;
        LVar3.super_LineCol.line = auVar4._8_8_;
        LVar3.super_LineCol.col = auVar4._16_8_;
        LVar3.name.str._4_4_ = uStack_84;
        LVar3.name.len = local_80;
        (*p_Var13)(msg,0x48,LVar3,pvVar12);
        pcVar11 = (this->m_state->line_contents).rem.str;
        pcVar9 = local_108.str;
        sVar8 = local_108.len;
      }
      goto LAB_001d120d;
    }
    if ((!bVar6) && (bVar6 = _advance_to_peeked(this), !bVar6)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        pcVar2 = (code *)swi(3);
        sVar16 = (substr)(*pcVar2)();
        return sVar16;
      }
      msg._24_16_ = (undefined1  [16])
                    to_csubstr(
                              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                              );
      msg._0_16_ = ZEXT816(0x7572) << 0x40;
      msg[0x10] = '\0';
      msg[0x11] = '\0';
      msg[0x12] = '\0';
      msg[0x13] = '\0';
      msg[0x14] = '\0';
      msg[0x15] = '\0';
      msg[0x16] = '\0';
      msg[0x17] = '\0';
      (*(code *)PTR_error_impl_00231528)
                ("check failed: _advance_to_peeked()",0x22,
                 (anonymous_namespace)::s_default_callbacks);
    }
    local_108 = _scan_to_next_nonempty_line(this,0);
    if (local_108.str == (char *)0x0 || local_108.len == 0) {
      bVar6 = is_debugger_attached();
      if ((bVar6) && (bVar6 = is_debugger_attached(), bVar6)) {
        pcVar2 = (code *)swi(3);
        sVar16 = (substr)(*pcVar2)();
        return sVar16;
      }
      cVar17.len = 0x25;
      cVar17.str = "ERROR: expected token or continuation";
      _err<>(this,cVar17);
    }
    bVar6 = false;
    chars_01.len = 7;
    chars_01.str = "[]{}?#,";
    sVar8 = basic_substring<const_char>::first_of(&local_108,chars_01,0);
  }
  msg._0_16_ = (undefined1  [16])basic_substring<const_char>::triml(&local_108,' ');
  chars_00.len = 2;
  chars_00.str = "\r\n";
  tpkl = basic_substring<const_char>::trimr((basic_substring<const_char> *)msg,chars_00);
  pattern.len = 2;
  pattern.str = ": ";
  bVar5 = basic_substring<const_char>::begins_with(&tpkl,pattern);
  if (!bVar5) {
    iVar7 = basic_substring<const_char>::compare(&tpkl,':');
    if (iVar7 != 0) {
      s0.len = 2;
      s0.str = ": ";
      s1.len = 1;
      s1.str = ":";
      fVar15 = basic_substring<const_char>::first_of_any(&local_108,s0,s1);
      len_ = fVar15.pos;
      if (sVar8 <= len_ || fVar15.which == 0xffffffffffffffff) goto LAB_001d0f18;
      if (local_108.len < len_) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
          pcVar2 = (code *)swi(3);
          sVar16 = (substr)(*pcVar2)();
          return sVar16;
        }
        handle_error(0x1e71c6,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x154e,"num <= len || num == npos");
      }
      basic_substring<const_char>::basic_substring
                ((basic_substring<const_char> *)msg,local_108.str,len_);
      local_108 = (csubstr)msg._0_16_;
      pcVar11 = (this->m_state->line_contents).rem.str;
      pcVar9 = (char *)msg._0_8_;
      sVar8 = msg._8_8_;
      if ((char *)(msg._0_8_ + msg._8_8_) < pcVar11) {
        pcVar11 = "check failed: (peeked_line.end() >= m_state->line_contents.rem.begin())";
        pcVar9 = msg;
        for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
          *(undefined8 *)pcVar9 = *(undefined8 *)pcVar11;
          pcVar11 = pcVar11 + ((ulong)bVar14 * -2 + 1) * 8;
          pcVar9 = pcVar9 + (ulong)bVar14 * -0x10 + 8;
        }
        if ((((byte)s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
          pcVar2 = (code *)swi(3);
          sVar16 = (substr)(*pcVar2)();
          return sVar16;
        }
        p_Var13 = (this->m_stack).m_callbacks.m_error;
        cVar17 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        pvVar12 = (this->m_stack).m_callbacks.m_user_data;
        local_58 = cVar17.len;
        uStack_70 = 0x7561;
        uStack_60 = cVar17.str._0_4_;
        uStack_5c = cVar17.str._4_4_;
        uStack_98 = uStack_70;
        uStack_88 = uStack_60;
        uStack_84 = uStack_5c;
        local_80 = local_58;
        goto LAB_001d11e5;
      }
LAB_001d120d:
      _line_progressed(this,(size_t)(pcVar9 + (sVar8 - (long)pcVar11)));
LAB_001d121d:
      basic_substring<char>::basic_substring
                (&local_40,currscalar.str,
                 (this->m_buf).str + (this->m_state->pos).super_LineCol.offset);
      chars_02.len = 3;
      chars_02.str = "\n\r ";
      bVar18 = basic_substring<char>::trimr(&local_40,chars_02);
      sVar16.str = bVar18.str;
      sVar16.len = bVar18.len;
      return sVar16;
    }
  }
  local_108.len = 0;
  goto LAB_001d121d;
}

Assistant:

substr Parser::_scan_plain_scalar_flow(csubstr currscalar, csubstr peeked_line)
{
    static constexpr const csubstr chars = "[]{}?#,";
    size_t pos = peeked_line.first_of(chars);
    bool first = true;
    while(pos != 0)
    {
        if(has_all(RMAP|RKEY) || has_any(RUNK))
        {
            csubstr tpkl = peeked_line.triml(' ').trimr("\r\n");
            if(tpkl.begins_with(": ") || tpkl == ':')
            {
                _c4dbgpf("rscalar[FLOW]: map value starts on the peeked line: '{}'", peeked_line);
                peeked_line = peeked_line.first(0);
                break;
            }
            else
            {
                auto colon_pos = peeked_line.first_of_any(": ", ":");
                if(colon_pos && colon_pos.pos < pos)
                {
                    peeked_line = peeked_line.first(colon_pos.pos);
                    _c4dbgpf("rscalar[FLOW]: found colon at {}. peeked='{}'", colon_pos.pos, peeked_line);
                    _RYML_CB_ASSERT(m_stack.m_callbacks, peeked_line.end() >= m_state->line_contents.rem.begin());
                    _line_progressed(static_cast<size_t>(peeked_line.end() - m_state->line_contents.rem.begin()));
                    break;
                }
            }
        }
        if(pos != npos)
        {
            _c4dbgpf("rscalar[FLOW]: found special character '{}' at {}, stopping: '{}'", peeked_line[pos], pos, peeked_line.left_of(pos).trimr("\r\n"));
            peeked_line = peeked_line.left_of(pos);
            _RYML_CB_ASSERT(m_stack.m_callbacks, peeked_line.end() >= m_state->line_contents.rem.begin());
            _line_progressed(static_cast<size_t>(peeked_line.end() - m_state->line_contents.rem.begin()));
            break;
        }
        _c4dbgpf("rscalar[FLOW]: append another line, full: '{}'", peeked_line.trimr("\r\n"));
        if(!first)
        {
            RYML_CHECK(_advance_to_peeked());
        }
        peeked_line = _scan_to_next_nonempty_line(/*indentation*/0);
        if(peeked_line.empty())
        {
            _c4err("expected token or continuation");
        }
        pos = peeked_line.first_of(chars);
        first = false;
    }
    substr full(m_buf.str + (currscalar.str - m_buf.str), m_buf.begin() + m_state->pos.offset);
    full = full.trimr("\n\r ");
    return full;
}